

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::buildProgramToTestShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  int iVar1;
  uint uVar2;
  GLuint GVar3;
  size_t sVar4;
  InternalError *this_00;
  TestError *this_01;
  char *src_tes;
  char *src_tcs;
  char *pcVar5;
  char *pcVar6;
  pointer_____offset_0x10___ *ppuVar7;
  char *src_gs;
  undefined8 *puVar8;
  ulong uVar9;
  bool is_program_built;
  string tested_shader_stage_code;
  stringstream stream;
  bool local_231;
  ulong local_230;
  shaderStage local_224;
  char *local_220;
  long local_218;
  char local_210;
  undefined7 uStack_20f;
  ulong local_200;
  imageStoreCall local_1f8;
  imageStoreCall local_1f0;
  coordinatesVariableDeclaration local_1e8;
  ImageLoadStoreMultipleUniformsTest *local_1e0;
  coordinatesVariableDeclaration local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_231 = true;
  local_220 = &local_210;
  local_218 = 0;
  local_210 = '\0';
  uVar2 = getMaximumImageUniformsForStage(this,stage);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (1 < (int)uVar2) {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
    local_1e0 = this;
    if ((int)stage < 8) {
      if (stage != fragmentShaderStage) {
        if (stage != geometryShaderStage) {
LAB_009e3488:
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Invalid shader stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                     ,0x245e);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pcVar5 = "layout(points) in;\nlayout(points, max_vertices = 1) out;\n\n";
      }
    }
    else if (stage == tesselationControlShaderStage) {
      pcVar5 = "layout(vertices = 4) out;\n\n";
    }
    else if (stage == tesselationEvalutaionShaderStage) {
      pcVar5 = "layout(quads, equal_spacing, ccw) in;\n\n";
    }
    else if (stage != vertexShaderStage) goto LAB_009e3488;
    local_224 = stage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\n"
               ,0x5f);
    sVar4 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
    local_230 = CONCAT44(local_230._4_4_,uVar2);
    local_200 = 1;
    if (1 < (int)uVar2) {
      local_200 = (ulong)uVar2;
    }
    puVar8 = &DAT_0212b4e8;
    uVar9 = 0;
    do {
      pcVar6 = "iimage2D";
      pcVar5 = "r32i";
      if (uVar9 < 0xe) {
        pcVar5 = (char *)puVar8[-1];
        pcVar6 = (char *)*puVar8;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
      iVar1 = (int)(ostream *)local_1a8;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") uniform ",10);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"u_image_",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + 5;
    } while (local_200 != uVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nvoid main()\n{\n",0xf);
    local_230 = local_230 & 0xffffffff;
    puVar8 = &DAT_0212b4f0;
    uVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      GVar3 = (GLuint)uVar9;
      local_1d8[0].m_row = 0;
      local_1d8[0].m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1e8.m_row = 1;
      local_1e8.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      pcVar5 = "ivec4";
      if (uVar9 < 0xe) {
        pcVar5 = (char *)*puVar8;
      }
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"loaded_value_",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = imageLoad(",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"u_image_",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      writeCoordinatesVariableNameToStream((ostream *)local_1a8,GVar3,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1f0.m_row = 0;
      local_1f0.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      local_1f8.m_row = 1;
      local_1f8.m_index = GVar3;
      anon_unknown_0::operator<<((ostream *)local_1a8,&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      uVar9 = uVar9 + 1;
      if (uVar9 < local_230) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      puVar8 = puVar8 + 5;
    } while (local_200 != uVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n\n",3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_1d8);
    this = local_1e0;
    stage = local_224;
    if ((long *)CONCAT44(local_1d8[0].m_row,local_1d8[0].m_index) != local_1c8) {
      operator_delete((long *)CONCAT44(local_1d8[0].m_row,local_1d8[0].m_index),local_1c8[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (local_218 == 0) {
    GVar3 = 0;
    goto LAB_009e33de;
  }
  if ((int)stage < 8) {
    if (stage == fragmentShaderStage) {
      pcVar5 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar6 = local_220;
LAB_009e33bd:
      src_gs = (char *)0x0;
    }
    else {
      if (stage != geometryShaderStage) {
LAB_009e3454:
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  ((TestError *)this_00,"Invalid shader stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                   ,0x237e);
        ppuVar7 = &tcu::TestError::typeinfo;
        goto LAB_009e3445;
      }
      pcVar5 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
      ;
      pcVar6 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      src_gs = local_220;
    }
    src_tes = (char *)0x0;
    src_tcs = (char *)0x0;
  }
  else if (stage == tesselationControlShaderStage) {
    pcVar5 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
    ;
    src_tes = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(quads, equal_spacing, ccw) in;\n\nvoid main()\n{\n\n}\n"
    ;
    pcVar6 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
    ;
    src_gs = (char *)0x0;
    src_tcs = local_220;
  }
  else {
    if (stage != tesselationEvalutaionShaderStage) {
      if (stage != vertexShaderStage) goto LAB_009e3454;
      pcVar5 = local_220;
      pcVar6 = 
      "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
      ;
      goto LAB_009e33bd;
    }
    pcVar5 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(location = 0) in vec4 i_position;\n\nvoid main()\n{\n  gl_Position = i_position;\n}\n"
    ;
    pcVar6 = 
    "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nvoid main()\n{\n    discard;\n}\n"
    ;
    src_gs = (char *)0x0;
    src_tes = local_220;
    src_tcs = (char *)0x0;
  }
  GVar3 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,pcVar5,src_tcs,src_tes,src_gs,pcVar6,
                     &local_231);
  if (local_231 != false) {
LAB_009e33de:
    if (local_220 != &local_210) {
      operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
    }
    return GVar3;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"Failed to build program",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
             ,0x2389);
  ppuVar7 = &tcu::InternalError::typeinfo;
LAB_009e3445:
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

GLuint buildProgramToTestShaderStage(shaderStage stage)
	{
		static const char* const boilerplate_fragment_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    discard;\n"
			"}\n";

		static const char* const boilerplate_tesselation_evaluation_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(quads, equal_spacing, ccw) in;\n"
			"\n"
			"void main()\n"
			"{\n"
			"\n"
			"}\n";

		static const char* const boilerplate_vertex_shader_code =
			"#version 400 core\n"
			"#extension GL_ARB_shader_image_load_store : require\n"
			"\n"
			"precision highp float;\n"
			"\n"
			"layout(location = 0) in vec4 i_position;\n"
			"\n"
			"void main()\n"
			"{\n"
			"  gl_Position = i_position;\n"
			"}\n";

		const char* fragment_shader_code			   = boilerplate_fragment_shader_code;
		const char* geometry_shader_code			   = 0;
		bool		is_program_built				   = true;
		GLuint		program_object_id				   = 0;
		const char* tesselation_control_shader_code	= 0;
		const char* tesselation_evaluation_shader_code = 0;
		std::string tested_shader_stage_code;
		const char* vertex_shader_code = boilerplate_vertex_shader_code;

		/* Get source code for tested shader stage */
		prepareShaderForTestedShaderStage(stage, tested_shader_stage_code);

		if (true == tested_shader_stage_code.empty())
		{
			return 0;
		}

		/* Set up source code for all required stages */
		switch (stage)
		{
		case fragmentShaderStage:
			fragment_shader_code = tested_shader_stage_code.c_str();
			break;

		case geometryShaderStage:
			geometry_shader_code = tested_shader_stage_code.c_str();
			break;

		case tesselationControlShaderStage:
			tesselation_control_shader_code	= tested_shader_stage_code.c_str();
			tesselation_evaluation_shader_code = boilerplate_tesselation_evaluation_shader_code;
			break;

		case tesselationEvalutaionShaderStage:
			tesselation_evaluation_shader_code = tested_shader_stage_code.c_str();
			break;

		case vertexShaderStage:
			vertex_shader_code = tested_shader_stage_code.c_str();
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		/* Build program */
		program_object_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		/* Check if program was built */
		if (false == is_program_built)
		{
			throw tcu::InternalError("Failed to build program", "", __FILE__, __LINE__);
		}

		/* Done */
		return program_object_id;
	}